

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
         *this)

{
  FloatFormat *fmt;
  double *pdVar1;
  _Rb_tree_node_base *p_Var2;
  Precision PVar3;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar4;
  Statement *pSVar5;
  ShaderExecutor *pSVar6;
  Variable<tcu::Vector<float,_4>_> *pVVar7;
  pointer pcVar8;
  Variable<float> *pVVar9;
  qpTestLog *pqVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  _Rb_tree_node_base *p_Var14;
  long lVar15;
  long lVar16;
  IVal *pIVar17;
  IVal *pIVar18;
  undefined8 *puVar19;
  long lVar20;
  Vector<float,_4> *pVVar21;
  MessageBuilder *pMVar22;
  _Base_ptr p_Var23;
  _Base_ptr p_Var24;
  undefined1 auVar25 [8];
  TestStatus *pTVar26;
  byte bVar27;
  IVal reference1;
  FuncSet funcs;
  IVal in3;
  Environment env;
  IVal in0;
  FloatFormat highpFmt;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_> outputs;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_vkt::shaderexecutor::Void>_>
  inputs;
  void *outputArr [2];
  void *inputArr [4];
  ResultCollector status;
  ostringstream oss;
  _Alloc_hider in_stack_fffffffffffffa98;
  _Alloc_hider _Var28;
  double dStack_560;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_558;
  undefined1 auStack_548 [7];
  IVal local_541;
  undefined1 local_540 [16];
  undefined1 local_530 [24];
  double local_518;
  IVal *local_4e0;
  pointer local_4d8;
  size_t local_4d0;
  TestStatus *local_4c8;
  string local_4c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_4a0;
  long local_470;
  undefined1 local_468 [8];
  qpTestLog *pqStack_460;
  IVal local_458;
  ios_base local_3f8 [8];
  ios_base local_3f0 [264];
  FloatFormat local_2e8;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
  local_2b8;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_vkt::shaderexecutor::Void>_>
  local_288;
  pointer local_228;
  pointer local_220;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  ResultCollector local_1f8;
  IVal local_1a8;
  ios_base local_138 [264];
  
  bVar27 = 0;
  this_00 = this->m_samplings;
  fmt = &(this->m_caseCtx).floatFormat;
  PVar3 = (this->m_caseCtx).precision;
  sVar4 = (this->m_caseCtx).numRandoms;
  local_4c8 = __return_storage_ptr__;
  iVar12 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,4>,tcu::Vector<float,4>,float,vkt::shaderexecutor::Void>>
            (&local_288,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_vkt::shaderexecutor::Void>_>
              *)fmt,(FloatFormat *)(ulong)PVar3,(Precision)sVar4,(ulong)(iVar12 + 0xdeadbeef),
             (deUint32)SUB84(in_stack_fffffffffffffa98._M_p,0));
  local_4d8 = local_288.in0.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_4d0 = (long)local_288.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_288.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>::Outputs
            (&local_2b8,local_4d0);
  local_2e8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_2e8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_2e8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_2e8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_2e8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_2e8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_2e8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_2e8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_2e8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_4a0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4a0._M_impl.super__Rb_tree_header._M_header;
  local_4a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4a0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4a0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4a0._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_4e0 = (IVal *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_288.in0.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_288.in1.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_208 = local_288.in2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_200 = local_288.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_228 = local_2b8.out0.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_220 = local_2b8.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_468 = (undefined1  [8])local_4e0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_460);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_460,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81((ostringstream *)&pqStack_460,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_460);
  std::ios_base::~ios_base(local_3f0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  p_Var2 = (_Rb_tree_node_base *)(local_540 + 8);
  local_540._8_4_ = _S_red;
  local_530._0_8_ = (_Base_ptr)0x0;
  local_518 = 0.0;
  pSVar5 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_530._8_8_ = p_Var2;
  local_530._16_8_ = p_Var2;
  (*pSVar5->_vptr_Statement[4])(pSVar5,local_540);
  if ((_Rb_tree_node_base *)local_530._8_8_ != p_Var2) {
    p_Var14 = (_Rb_tree_node_base *)local_530._8_8_;
    do {
      (**(code **)(**(long **)(p_Var14 + 1) + 0x30))(*(long **)(p_Var14 + 1),&local_1a8);
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    } while (p_Var14 != p_Var2);
  }
  if (local_518 != 0.0) {
    local_468 = (undefined1  [8])local_4e0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_460);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pqStack_460,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pqStack_460,in_stack_fffffffffffffa98._M_p,(long)dStack_560);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_fffffffffffffa98._M_p != &aStack_558) {
      operator_delete(in_stack_fffffffffffffa98._M_p,aStack_558._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_460);
    std::ios_base::~ios_base(local_3f0);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_540);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  pSVar6 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar6->_vptr_ShaderExecutor[2])(pSVar6,local_4d0,&local_218,&local_228,0);
  lVar15 = 8;
  do {
    *(undefined1 *)((long)&local_470 + lVar15) = 0;
    *(undefined8 *)(local_468 + lVar15) = 0x7ff0000000000000;
    *(undefined8 *)((long)&pqStack_460 + lVar15) = 0xfff0000000000000;
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x68);
  lVar15 = 8;
  do {
    *(undefined1 *)((long)&local_470 + lVar15) = 0;
    *(undefined8 *)(local_468 + lVar15) = 0x7ff0000000000000;
    *(undefined8 *)((long)&pqStack_460 + lVar15) = 0xfff0000000000000;
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x68);
  lVar15 = 8;
  do {
    *(undefined1 *)((long)local_1a8.m_data + lVar15 + -8) = 0;
    *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar15) = 0x7ff0000000000000;
    *(undefined8 *)((long)&local_1a8.m_data[0].m_lo + lVar15) = 0xfff0000000000000;
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x68);
  lVar15 = 8;
  do {
    *(undefined1 *)((long)local_1a8.m_data + lVar15 + -8) = 0;
    *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar15) = 0x7ff0000000000000;
    *(undefined8 *)((long)&local_1a8.m_data[0].m_lo + lVar15) = 0xfff0000000000000;
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x68);
  aStack_558._M_allocated_capacity = 0xfff0000000000000;
  lVar15 = 8;
  do {
    auStack_548[lVar15] = 0;
    *(undefined8 *)(local_540 + lVar15) = 0x7ff0000000000000;
    *(undefined8 *)(local_540 + lVar15 + 8) = 0xfff0000000000000;
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x68);
  lVar15 = 8;
  do {
    auStack_548[lVar15] = 0;
    *(undefined8 *)(local_540 + lVar15) = 0x7ff0000000000000;
    *(undefined8 *)(local_540 + lVar15 + 8) = 0xfff0000000000000;
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x68);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_4a0,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_468);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_4a0,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             &local_1a8);
  Environment::bind<float>
            ((Environment *)&local_4a0,
             (this->m_variables).in2.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,(IVal *)&stack0xfffffffffffffa98);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_4a0,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4c0);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_4a0,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_540);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_4a0,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_541);
  if (local_288.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish == local_4d8) {
LAB_008f1e44:
    local_468 = (undefined1  [8])local_4e0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_460);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_460,"All ",4);
    pTVar26 = local_4c8;
    std::ostream::_M_insert<unsigned_long>((ulong)&pqStack_460);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pqStack_460," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_460);
    std::ios_base::~ios_base(local_3f0);
    local_468 = (undefined1  [8])&local_458;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"Pass","");
    pTVar26->m_code = QP_TEST_RESULT_PASS;
    (pTVar26->m_description)._M_dataplus._M_p = (pointer)&(pTVar26->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar26->m_description,local_468,
               (long)&pqStack_460->flags + (long)&((Interval *)local_468)->m_hasNaN);
    p_Var23 = (_Base_ptr)local_458.m_data[0]._0_8_;
    auVar25 = local_468;
    if (local_468 == (undefined1  [8])&local_458) goto LAB_008f2031;
  }
  else {
    local_470 = local_4d0 + (local_4d0 == 0);
    lVar15 = 0;
    local_4d8 = (pointer)0x0;
    do {
      lVar16 = 8;
      do {
        *(undefined1 *)((long)local_1a8.m_data + lVar16 + -8) = 0;
        *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar16) = 0x7ff0000000000000;
        *(undefined8 *)((long)&local_1a8.m_data[0].m_lo + lVar16) = 0xfff0000000000000;
        lVar16 = lVar16 + 0x18;
      } while (lVar16 != 0x68);
      lVar16 = 8;
      do {
        *(undefined1 *)((long)local_1a8.m_data + lVar16 + -8) = 0;
        *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar16) = 0x7ff0000000000000;
        *(undefined8 *)((long)&local_1a8.m_data[0].m_lo + lVar16) = 0xfff0000000000000;
        lVar16 = lVar16 + 0x18;
      } while (lVar16 != 0x68);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_540,fmt,(Vector<float,_4> *)&stack0xfffffffffffffa98);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_468,fmt,(IVal *)local_540);
      pIVar17 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_4a0,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      pMVar22 = (MessageBuilder *)local_468;
      for (lVar16 = 0xc; lVar16 != 0; lVar16 = lVar16 + -1) {
        *(TestLog **)pIVar17->m_data = pMVar22->m_log;
        pMVar22 = (MessageBuilder *)((long)pMVar22 + (ulong)bVar27 * -0x10 + 8);
        pIVar17 = (IVal *)((long)pIVar17 + ((ulong)bVar27 * -2 + 1) * 8);
      }
      _Var28._M_p = *(pointer *)
                     local_288.in1.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar15].m_data;
      lVar16 = *(long *)(local_288.in1.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar15].m_data + 2);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_540,fmt,(Vector<float,_4> *)&stack0xfffffffffffffa98);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_468,fmt,(IVal *)local_540);
      pIVar17 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_4a0,
                           (this->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      pMVar22 = (MessageBuilder *)local_468;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(TestLog **)pIVar17->m_data = pMVar22->m_log;
        pMVar22 = (MessageBuilder *)((long)pMVar22 + (ulong)bVar27 * -0x10 + 8);
        pIVar17 = (IVal *)((long)pIVar17 + ((ulong)bVar27 * -2 + 1) * 8);
      }
      pqVar10 = (qpTestLog *)
                (double)local_288.in2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar15];
      bVar11 = NAN(local_288.in2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar15]);
      local_468[0] = bVar11;
      pqStack_460 = (qpTestLog *)0x7ff0000000000000;
      if (!bVar11) {
        pqStack_460 = pqVar10;
      }
      local_458.m_data[0]._0_8_ = (qpTestLog *)0xfff0000000000000;
      if (!bVar11) {
        local_458.m_data[0]._0_8_ = pqVar10;
      }
      tcu::FloatFormat::roundOut
                ((Interval *)&stack0xfffffffffffffa98,fmt,(Interval *)local_468,false);
      tcu::FloatFormat::convert((Interval *)local_540,fmt,(Interval *)&stack0xfffffffffffffa98);
      pIVar18 = Environment::lookup<float>
                          ((Environment *)&local_4a0,
                           (this->m_variables).in2.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
      pIVar18->m_hi = (double)local_530._0_8_;
      *(undefined8 *)pIVar18 = local_540._0_8_;
      pIVar18->m_lo = (double)CONCAT44(local_540._12_4_,local_540._8_4_);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_4a0,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_458.m_data[1]._0_4_ = (this->m_caseCtx).precision;
      local_458.m_data[0].m_hi = (this->m_caseCtx).floatFormat.m_maxValue;
      local_468 = *(undefined1 (*) [8])fmt;
      pqStack_460 = *(qpTestLog **)&(this->m_caseCtx).floatFormat.m_fractionBits;
      local_458.m_data[0]._0_8_ = *(undefined8 *)&(this->m_caseCtx).floatFormat.m_hasInf;
      local_458.m_data[0].m_lo._0_1_ = (this->m_caseCtx).floatFormat.m_exactPrecision;
      local_458.m_data[0].m_lo._1_3_ = *(undefined3 *)&(this->m_caseCtx).floatFormat.field_0x19;
      local_458.m_data[0].m_lo._4_4_ = *(undefined4 *)&(this->m_caseCtx).floatFormat.field_0x1c;
      local_458.m_data[1].m_hi._0_4_ = 0;
      pSVar5 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_458.m_data[1].m_lo = (double)&local_4a0;
      (*pSVar5->_vptr_Statement[3])(pSVar5,(MessageBuilder *)local_468);
      pIVar17 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_4a0,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_468,&local_2e8,pIVar17);
      pMVar22 = (MessageBuilder *)local_468;
      pIVar17 = &local_1a8;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(TestLog **)pIVar17->m_data = pMVar22->m_log;
        pMVar22 = (MessageBuilder *)((long)pMVar22 + (ulong)bVar27 * -0x10 + 8);
        pIVar17 = (IVal *)((long)pIVar17 + ((ulong)bVar27 * -2 + 1) * 8);
      }
      bVar11 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                         (&local_1a8,
                          local_2b8.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar15);
      local_468 = (undefined1  [8])&local_458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"Shader output 0 is outside acceptable range","");
      bVar11 = tcu::ResultCollector::check(&local_1f8,bVar11,(string *)local_468);
      if (local_468 != (undefined1  [8])&local_458) {
        operator_delete((void *)local_468,
                        (ulong)((long)(_Rb_tree_color *)local_458.m_data[0]._0_8_ + 1));
      }
      if ((!bVar11) &&
         (uVar13 = (int)local_4d8 + 1, local_4d8 = (pointer)(ulong)uVar13, (int)uVar13 < 0x65)) {
        local_468 = (undefined1  [8])local_4e0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_460);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_460,"Failed",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_460," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_460,"\t",1);
        pVVar7 = (this->m_variables).in0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr
        ;
        pVVar21 = (Vector<float,_4> *)local_530;
        pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
        local_540._0_8_ = pVVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_540,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pqStack_460,(char *)local_540._0_8_,
                   CONCAT44(local_540._12_4_,local_540._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_460," = ",3);
        valueToString<tcu::Vector<float,4>>
                  ((string *)&stack0xfffffffffffffa98,(shaderexecutor *)&local_2e8,
                   (FloatFormat *)
                   (local_288.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar15),pVVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pqStack_460,_Var28._M_p,lVar16);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_460,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var28._M_p != &aStack_558) {
          operator_delete(_Var28._M_p,aStack_558._M_allocated_capacity + 1);
        }
        if ((Vector<float,_4> *)local_540._0_8_ != (Vector<float,_4> *)local_530) {
          operator_delete((void *)local_540._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_530._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_460,"\t",1);
        pVVar7 = (this->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr
        ;
        pVVar21 = (Vector<float,_4> *)local_530;
        pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
        local_540._0_8_ = pVVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_540,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pqStack_460,(char *)local_540._0_8_,
                   CONCAT44(local_540._12_4_,local_540._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_460," = ",3);
        valueToString<tcu::Vector<float,4>>
                  ((string *)&stack0xfffffffffffffa98,(shaderexecutor *)&local_2e8,
                   (FloatFormat *)
                   (local_288.in1.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar15),pVVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pqStack_460,_Var28._M_p,lVar16);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_460,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var28._M_p != &aStack_558) {
          operator_delete(_Var28._M_p,aStack_558._M_allocated_capacity + 1);
        }
        if ((Vector<float,_4> *)local_540._0_8_ != (Vector<float,_4> *)local_530) {
          operator_delete((void *)local_540._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_530._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_460,"\t",1);
        pVVar9 = (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr;
        local_540._0_8_ = local_530;
        pcVar8 = (pVVar9->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_540,pcVar8,pcVar8 + (pVVar9->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pqStack_460,(char *)local_540._0_8_,
                   CONCAT44(local_540._12_4_,local_540._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_460," = ",3);
        valueToString<float>
                  ((string *)&stack0xfffffffffffffa98,&local_2e8,
                   local_288.in2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pqStack_460,_Var28._M_p,lVar16);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_460,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var28._M_p != &aStack_558) {
          operator_delete(_Var28._M_p,aStack_558._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_540._0_8_ != local_530) {
          operator_delete((void *)local_540._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_530._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_460,"\t",1);
        pVVar7 = (this->m_variables).out0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr
        ;
        pIVar17 = (IVal *)local_530;
        pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
        local_540._0_8_ = pIVar17;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_540,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pqStack_460,(char *)local_540._0_8_,
                   CONCAT44(local_540._12_4_,local_540._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_460," = ",3);
        valueToString<tcu::Vector<float,4>>
                  ((string *)&stack0xfffffffffffffa98,(shaderexecutor *)&local_2e8,
                   (FloatFormat *)
                   (local_2b8.out0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar15),(Vector<float,_4> *)pIVar17)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pqStack_460,_Var28._M_p,lVar16);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_460,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pqStack_460,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,4>>
                  (&local_4c0,(shaderexecutor *)&local_2e8,(FloatFormat *)&local_1a8,pIVar17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pqStack_460,local_4c0._M_dataplus._M_p,local_4c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_460,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
          operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var28._M_p != &aStack_558) {
          operator_delete(_Var28._M_p,aStack_558._M_allocated_capacity + 1);
        }
        if ((IVal *)local_540._0_8_ != (IVal *)local_530) {
          operator_delete((void *)local_540._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_530._0_8_ + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_460);
        std::ios_base::~ios_base(local_3f0);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != local_470);
    iVar12 = (int)local_4d8;
    if (iVar12 < 0x65) {
      if (iVar12 == 0) goto LAB_008f1e44;
    }
    else {
      local_468 = (undefined1  [8])local_4e0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_460);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_460,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&pqStack_460,iVar12 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_460," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_460);
      std::ios_base::~ios_base(local_3f0);
    }
    local_468 = (undefined1  [8])local_4e0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_460);
    std::ostream::operator<<((ostringstream *)&pqStack_460,iVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_460,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&pqStack_460);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pqStack_460," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_460);
    std::ios_base::~ios_base(local_3f0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
    std::ostream::operator<<(local_468,iVar12);
    pTVar26 = local_4c8;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
    std::ios_base::~ios_base(local_3f8);
    local_468 = (undefined1  [8])&local_458;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_468," test failed. Check log for the details","");
    p_Var23 = (_Base_ptr)((long)&pqStack_460->flags + CONCAT44(local_540._12_4_,local_540._8_4_));
    p_Var24 = (_Base_ptr)0xf;
    if ((IVal *)local_540._0_8_ != (IVal *)local_530) {
      p_Var24 = (_Base_ptr)local_530._0_8_;
    }
    if (p_Var24 < p_Var23) {
      p_Var24 = (_Base_ptr)0xf;
      if (local_468 != (undefined1  [8])&local_458) {
        p_Var24 = (_Base_ptr)local_458.m_data[0]._0_8_;
      }
      if (p_Var24 < p_Var23) goto LAB_008f1e35;
      puVar19 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_468,0,(char *)0x0,local_540._0_8_);
    }
    else {
LAB_008f1e35:
      puVar19 = (undefined8 *)std::__cxx11::string::_M_append(local_540,(ulong)local_468);
    }
    local_1a8.m_data[0]._0_8_ = &local_1a8.m_data[0].m_hi;
    pdVar1 = (double *)(puVar19 + 2);
    if ((double *)*puVar19 == pdVar1) {
      local_1a8.m_data[0].m_hi = *pdVar1;
      local_1a8.m_data[1]._0_4_ = *(undefined4 *)(puVar19 + 3);
      local_1a8.m_data[1]._4_4_ = *(undefined4 *)((long)puVar19 + 0x1c);
    }
    else {
      local_1a8.m_data[0].m_hi = *pdVar1;
      local_1a8.m_data[0]._0_8_ = (double *)*puVar19;
    }
    local_1a8.m_data[0].m_lo = (double)puVar19[1];
    *puVar19 = pdVar1;
    puVar19[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar26->m_code = QP_TEST_RESULT_FAIL;
    (pTVar26->m_description)._M_dataplus._M_p = (pointer)&(pTVar26->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar26->m_description,local_1a8.m_data[0]._0_8_,
               (undefined1 *)((long)local_1a8.m_data[0].m_lo + local_1a8.m_data[0]._0_8_));
    if ((double *)local_1a8.m_data[0]._0_8_ != &local_1a8.m_data[0].m_hi) {
      operator_delete((void *)local_1a8.m_data[0]._0_8_,(long)local_1a8.m_data[0].m_hi + 1);
    }
    if (local_468 != (undefined1  [8])&local_458) {
      operator_delete((void *)local_468,
                      (ulong)((long)(_Rb_tree_color *)local_458.m_data[0]._0_8_ + 1));
    }
    p_Var23 = (_Base_ptr)local_530._0_8_;
    auVar25 = (undefined1  [8])local_540._0_8_;
    if ((IVal *)local_540._0_8_ == (IVal *)local_530) goto LAB_008f2031;
  }
  operator_delete((void *)auVar25,(ulong)((long)&p_Var23->_M_color + 1));
LAB_008f2031:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_4a0);
  if (local_2b8.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2b8.out0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.out0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b8.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_288.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_288.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_288.in2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.in2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_288.in2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.in2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_288.in1.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.in1.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_288.in1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.in1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_288.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_288.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar26;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}